

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::IndexedStateQueryTests::init
          (IndexedStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  IndexedStateQueryTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::TransformFeedbackBufferBindingCase::TransformFeedbackBufferBindingCase
            ((TransformFeedbackBufferBindingCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "transform_feedback_buffer_binding","TRANSFORM_FEEDBACK_BUFFER_BINDING");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::TransformFeedbackBufferBufferCase::TransformFeedbackBufferBufferCase
            ((TransformFeedbackBufferBufferCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "transform_feedback_buffer_start_size",
             "TRANSFORM_FEEDBACK_BUFFER_START and TRANSFORM_FEEDBACK_BUFFER_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  Functional::anon_unknown_0::UniformBufferBindingCase::UniformBufferBindingCase
            ((UniformBufferBindingCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform_buffer_binding","UNIFORM_BUFFER_BINDING");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  Functional::anon_unknown_0::UniformBufferBufferCase::UniformBufferBufferCase
            ((UniformBufferBufferCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform_buffer_start_size","UNIFORM_BUFFER_START and UNIFORM_BUFFER_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void IndexedStateQueryTests::init (void)
{
	// transform feedback
	addChild(new TransformFeedbackBufferBindingCase(m_context, "transform_feedback_buffer_binding", "TRANSFORM_FEEDBACK_BUFFER_BINDING"));
	addChild(new TransformFeedbackBufferBufferCase(m_context, "transform_feedback_buffer_start_size", "TRANSFORM_FEEDBACK_BUFFER_START and TRANSFORM_FEEDBACK_BUFFER_SIZE"));

	// uniform buffers
	addChild(new UniformBufferBindingCase(m_context, "uniform_buffer_binding", "UNIFORM_BUFFER_BINDING"));
	addChild(new UniformBufferBufferCase(m_context, "uniform_buffer_start_size", "UNIFORM_BUFFER_START and UNIFORM_BUFFER_SIZE"));
}